

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

void __thiscall QRasterPaintEngine::updateBrush(QRasterPaintEngine *this,QBrush *brush)

{
  QPaintEnginePrivate *pQVar1;
  QRasterPaintEnginePrivate *this_00;
  TransformationType TVar2;
  QPaintEngine *pQVar3;
  long lVar4;
  QPaintEngineState *pQVar5;
  QTransform *pQVar6;
  qreal *pqVar7;
  QPaintEngineState *pQVar8;
  QTransform *pQVar9;
  QPaintEngineState *pQVar10;
  long in_FS_OFFSET;
  byte bVar11;
  QTransform m;
  QTransform local_80;
  long local_30;
  
  bVar11 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar10 = pQVar5 + -2;
  if (pQVar5 == (QPaintEngineState *)0x0) {
    pQVar10 = (QPaintEngineState *)0x0;
  }
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar5 = pQVar1->q_ptr->state;
  if (((pQVar5 == (QPaintEngineState *)0x0) ||
      (pQVar3 = *(QPaintEngine **)(pQVar5 + 0x100), pQVar3 == (QPaintEngine *)0x0)) ||
     (((ulong)pQVar3[2].state & 1) == 0)) {
    pQVar3 = pQVar1[10].q_ptr;
  }
  *(QPaintEngine **)(pQVar10 + 0xda) = pQVar3;
  QSpanData::setup((QSpanData *)(pQVar10 + 0xba),brush,
                   pQVar10[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   pQVar10[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   (bool)(*(byte *)((long)&pQVar10[0x105].dirtyFlags.
                                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i + 1) & 1))
  ;
  if ((pQVar10[0xfc].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
       super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
    pQVar6 = &((brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->transform;
    pQVar9 = &local_80;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pQVar9->m_matrix[0][0] = pQVar6->m_matrix[0][0];
      pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar11 * -2 + 1) * 8);
      pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    TVar2 = QTransform::type(&local_80);
    if ((int)TVar2 < 0) goto LAB_003bd58a;
  }
  this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar8 = pQVar1->q_ptr->state;
  pQVar5 = pQVar8 + -2;
  if (pQVar8 == (QPaintEngineState *)0x0) {
    pQVar5 = (QPaintEngineState *)0x0;
  }
  pqVar7 = (qreal *)&DAT_006aeba0;
  pQVar6 = &local_80;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pQVar6->m_matrix[0][0] = *pqVar7;
    pqVar7 = pqVar7 + (ulong)bVar11 * -2 + 1;
    pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pQVar8 = pQVar5 + 0x36;
  pQVar6 = &local_80;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pQVar6->m_matrix[0][0] = *(qreal *)pQVar8;
    pQVar8 = pQVar8 + (ulong)bVar11 * -4 + 2;
    pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  QTransform::translate(&local_80,*(qreal *)(pQVar5 + 4),*(qreal *)(pQVar5 + 6));
  QRasterPaintEnginePrivate::updateMatrixData(this_00,(QSpanData *)(pQVar10 + 0xba),brush,&local_80)
  ;
LAB_003bd58a:
  QBrush::operator=((QBrush *)(pQVar10 + 0xb8),brush);
  pQVar10[0xfc].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::updateBrush(const QBrush &brush)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::updateBrush()" << brush;
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();
    // must set clip prior to setup, as setup uses it...
    s->brushData.clip = d->clip();
    s->brushData.setup(brush, s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);
    if (s->fillFlags & DirtyTransform
        || brush.transform().type() >= QTransform::TxNone)
        d_func()->updateMatrixData(&s->brushData, brush, d->brushMatrix());
    s->lastBrush = brush;
    s->fillFlags = 0;
}